

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

void mpi_sub_hlp(size_t n,mbedtls_mpi_uint *s,mbedtls_mpi_uint *d)

{
  ulong uVar1;
  mbedtls_mpi_uint z;
  mbedtls_mpi_uint c;
  size_t i;
  mbedtls_mpi_uint *d_local;
  mbedtls_mpi_uint *s_local;
  size_t n_local;
  
  z = 0;
  i = (size_t)d;
  d_local = s;
  for (c = 0; c < n; c = c + 1) {
    uVar1 = *(ulong *)i;
    *(mbedtls_mpi_uint *)i = *(long *)i - z;
    z = (long)(int)(uint)(*(ulong *)i < *d_local) + (long)(int)(uint)(uVar1 < z);
    *(mbedtls_mpi_uint *)i = *(long *)i - *d_local;
    d_local = d_local + 1;
    i = i + 8;
  }
  for (; z != 0; z = (mbedtls_mpi_uint)(int)(uint)(uVar1 < z)) {
    uVar1 = *(ulong *)i;
    *(mbedtls_mpi_uint *)i = *(long *)i - z;
    i = i + 8;
  }
  return;
}

Assistant:

static void mpi_sub_hlp( size_t n, mbedtls_mpi_uint *s, mbedtls_mpi_uint *d )
{
    size_t i;
    mbedtls_mpi_uint c, z;

    for( i = c = 0; i < n; i++, s++, d++ )
    {
        z = ( *d <  c );     *d -=  c;
        c = ( *d < *s ) + z; *d -= *s;
    }

    while( c != 0 )
    {
        z = ( *d < c ); *d -= c;
        c = z; i++; d++;
    }
}